

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O3

double tu_product(int i,int j,double x)

{
  uint uVar1;
  int iVar2;
  uint n;
  int n_00;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if ((j | i) < 0) {
    dVar5 = 0.0;
  }
  else {
    if (i == 0) {
      dVar5 = u_polynomial_value(j,x);
      return dVar5;
    }
    uVar1 = i - j;
    n = -uVar1;
    if (0 < (int)uVar1) {
      n = uVar1;
    }
    dVar5 = 0.0;
    if (n <= (uint)(j + i)) {
      do {
        dVar3 = u_polynomial_value(n,x);
        dVar5 = dVar5 + dVar3;
        n = n + 2;
      } while ((int)n <= j + i);
    }
    iVar2 = (i + -2) - j;
    n_00 = -iVar2;
    if (0 < iVar2) {
      n_00 = iVar2;
    }
    dVar3 = 0.0;
    for (; n_00 <= j + i + -2; n_00 = n_00 + 2) {
      dVar4 = u_polynomial_value(n_00,x);
      dVar3 = dVar3 + dVar4;
    }
    dVar5 = (dVar5 - dVar3) * 0.5;
  }
  return dVar5;
}

Assistant:

double tu_product ( int i, int j, double x )

//****************************************************************************80
//
//  Purpose:
//
//    TU_PRODUCT: evaluate T(i,x)*U(j,x)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 July 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int I, J, the indices.
//
//    Input, double X, the argument.
//
//    Output, double TU_PRODUCT, the value.
//
{
  double value;

  if ( i < 0 )
  {
    value = 0.0;
  }
  else if ( j < 0 )
  {
    value = 0.0;
  }
  else if ( i == 0 )
  {
    value = u_polynomial_value ( j, x );
  }
  else
  {
    value = 0.5 * ( uu_product ( i, j, x ) - uu_product ( i - 2, j, x ) );
  }

  return value;
}